

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.hpp
# Opt level: O0

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
ImageT<float,_4U>::getB10G11R11(ImageT<float,_4U> *this)

{
  uchar *puVar1;
  float *pfVar2;
  size_type in_RSI;
  ImageT<float,_4U> *in_RDI;
  uint32 outValue;
  float b;
  float g;
  float r;
  Color pixel;
  uchar *target;
  uint32_t x;
  uint32_t y;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *data;
  anon_union_16_2_6556a7fb_for_color<float,_4U>_3 *this_00;
  Color *in_stack_ffffffffffffff68;
  ImageT<float,_4U> *this_01;
  vec<3,_float,_(glm::precision)0> local_64;
  uint32 local_58;
  float local_54;
  float local_50;
  float local_4c;
  anon_union_16_2_6556a7fb_for_color<float,_4U>_3 local_48;
  uint32 *local_38;
  uint local_2c;
  uint local_28;
  undefined1 local_11;
  
  local_11 = 0;
  this_01 = in_RDI;
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x245a8c);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_01,in_RSI,
             (allocator_type *)in_RDI);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x245aaf);
  for (local_28 = 0; local_28 < *(uint *)(in_RSI + 0xc); local_28 = local_28 + 1) {
    for (local_2c = 0; local_2c < *(uint *)(in_RSI + 8); local_2c = local_2c + 1) {
      puVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x245af3);
      local_38 = (uint32 *)(puVar1 + (local_28 * *(int *)(in_RSI + 8) + local_2c) * 4);
      in_stack_ffffffffffffff68 =
           operator()(in_RDI,(uint32_t)((ulong)in_stack_ffffffffffffff68 >> 0x20),
                      (uint32_t)in_stack_ffffffffffffff68);
      local_48._0_8_ = *(undefined8 *)&in_stack_ffffffffffffff68->field_0;
      local_48._8_8_ = *(undefined8 *)((long)&in_stack_ffffffffffffff68->field_0 + 8);
      this_00 = &local_48;
      pfVar2 = color<float,_4U>::operator[]((color<float,_4U> *)&this_00->field_1,0);
      local_4c = *pfVar2;
      pfVar2 = color<float,_4U>::operator[]((color<float,_4U> *)&this_00->field_1,1);
      local_50 = *pfVar2;
      pfVar2 = color<float,_4U>::operator[]((color<float,_4U> *)&this_00->field_1,2);
      local_54 = *pfVar2;
      glm::vec<3,_float,_(glm::precision)0>::vec(&local_64,local_4c,local_50,local_54);
      local_58 = glm::packF2x11_1x10((vec3 *)&this_00->field_1);
      *local_38 = local_58;
    }
  }
  return (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_RDI;
}

Assistant:

virtual std::vector<uint8_t> getB10G11R11() const override {
        assert(3 <= componentCount);
        assert(std::is_floating_point_v<componentType>);

        std::vector<uint8_t> data(height * width * 4);

        for (uint32_t y = 0; y < height; ++y) {
            for (uint32_t x = 0; x < width; ++x) {
                auto* target = data.data() + (y * width + x) * 4;

                const auto pixel = (*this)(x, y);
                const auto r = pixel[0];
                const auto g = pixel[1];
                const auto b = pixel[2];
                const auto outValue = glm::packF2x11_1x10(glm::vec3(r, g, b));
                std::memcpy(target, &outValue, sizeof(outValue));
            }
        }

        return data;
    }